

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::globalError(CoreBroker *this,int32_t errorCode,string_view errorString)

{
  GlobalBrokerId id;
  BrokerBase *in_RDI;
  ActionMessage error;
  undefined4 in_stack_ffffffffffffff14;
  GlobalFederateId local_dc [2];
  action_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  SmallBuffer *in_stack_ffffffffffffff38;
  
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
  id = BrokerBase::getGlobalId(in_RDI);
  GlobalFederateId::GlobalFederateId(local_dc,id);
  SmallBuffer::operator=
            (in_stack_ffffffffffffff38,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,local_dc[0].gid));
  BrokerBase::addActionMessage
            ((BrokerBase *)CONCAT44(in_stack_ffffffffffffff14,id.gid),(ActionMessage *)in_RDI);
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(in_stack_ffffffffffffff14,id.gid));
  return;
}

Assistant:

void CoreBroker::globalError(int32_t errorCode, std::string_view errorString)
{
    ActionMessage error(CMD_GLOBAL_ERROR);
    error.source_id = getGlobalId();
    error.messageID = errorCode;
    error.payload = errorString;
    addActionMessage(error);
}